

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_number_of_quasiparticles(void)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int iVar22;
  undefined1 auVar23 [64];
  undefined8 auStack_60 [3];
  undefined8 local_48;
  int local_40;
  int local_3c [3];
  
  local_48 = (ulong)(n_ion_populations + 3);
  uVar13 = (ulong)(n_ion_populations + 3) * 4 + 0xf & 0xfffffffffffffff0;
  lVar6 = -uVar13;
  piVar14 = (int *)((long)&local_48 + lVar6);
  *(undefined8 *)piVar14 =
       *(undefined8 *)
        ((long)psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 200);
  uVar10 = local_48;
  *(undefined4 *)((long)&local_40 - uVar13) =
       *(undefined4 *)
        ((long)psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd0);
  if (0 < (long)n_ion_populations) {
    lVar1 = *(long *)((long)psr._M_t.
                            super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                            .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd8);
    lVar11 = 0;
    do {
      *(undefined4 *)((long)local_3c + lVar11 * 4 + lVar6) = *(undefined4 *)(lVar1 + lVar11 * 4);
      lVar11 = lVar11 + 1;
    } while (n_ion_populations != lVar11);
  }
  if (mpi_rank == 0) {
    if (n_sr < 1) {
      local_3c[0] = 0;
      local_3c[1] = 0;
      local_3c[2] = 0;
      iVar22 = 0;
    }
    else {
      iVar12 = 0;
      local_3c[2] = 0;
      local_3c[1] = 0;
      local_3c[0] = 0;
      iVar22 = 0;
      do {
        uVar10 = local_48;
        if (iVar12 != 0) {
          *(undefined8 *)((long)auStack_60 + lVar6 + 8) = 0;
          *(undefined8 *)((long)auStack_60 + lVar6) = 0x121dc8;
          MPI_Recv(piVar14,uVar10,&ompi_mpi_int,iVar12,0,&ompi_mpi_comm_world);
        }
        local_3c[2] = local_3c[2] + *piVar14;
        local_3c[1] = local_3c[1] + *(int *)((long)&local_48 + lVar6 + 4);
        local_40 = iVar22 + *(int *)((long)&local_40 + lVar6);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121dfb;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Thread #",9);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e05;
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e1c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\t",2);
        iVar22 = *piVar14;
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e27;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar22);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e3e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," e, ",4);
        iVar22 = *(int *)((long)&local_48 + lVar6 + 4);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e4a;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar22);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e61;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," p, ",4);
        iVar22 = *(int *)((long)&local_40 + lVar6);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e6d;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar22);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121e81;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," g",2);
        if (-1 < n_ion_populations) {
          if (n_ion_populations == 0) {
            iVar22 = 0;
          }
          else {
            auVar17 = vpbroadcastq_avx512f();
            auVar23 = ZEXT1664((undefined1  [16])0x0);
            uVar10 = 0;
            auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              auVar20 = vmovdqa64_avx512f(auVar23);
              auVar23 = vpbroadcastq_avx512f();
              auVar21 = vporq_avx512f(auVar23,auVar18);
              auVar23 = vporq_avx512f(auVar23,auVar19);
              uVar5 = vpcmpuq_avx512f(auVar23,auVar17,2);
              bVar7 = (byte)uVar5;
              uVar5 = vpcmpuq_avx512f(auVar21,auVar17,2);
              bVar8 = (byte)uVar5;
              uVar15 = CONCAT11(bVar8,bVar7);
              auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           ((long)local_3c + uVar10 * 4 + lVar6));
              auVar21._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar23._4_4_;
              auVar21._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_;
              auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar23._8_4_;
              auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar23._12_4_;
              auVar21._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar23._16_4_;
              auVar21._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar23._20_4_;
              auVar21._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar23._24_4_;
              auVar21._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar23._28_4_;
              auVar21._32_4_ = (uint)(bVar8 & 1) * auVar23._32_4_;
              auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar23._36_4_;
              auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar23._40_4_;
              auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar23._44_4_;
              auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar23._48_4_;
              auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar23._52_4_;
              auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar23._56_4_;
              auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar23._60_4_;
              auVar23 = vpaddd_avx512f(auVar21,auVar20);
              uVar10 = uVar10 + 0x10;
            } while ((n_ion_populations + 0xfU & 0xfffffff0) != uVar10);
            auVar17 = vmovdqa32_avx512f(auVar23);
            auVar18._0_4_ =
                 (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
            bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar18._4_4_ = (uint)bVar2 * auVar17._4_4_ | (uint)!bVar2 * auVar20._4_4_;
            bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar18._8_4_ = (uint)bVar2 * auVar17._8_4_ | (uint)!bVar2 * auVar20._8_4_;
            bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar18._12_4_ = (uint)bVar2 * auVar17._12_4_ | (uint)!bVar2 * auVar20._12_4_;
            bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar18._16_4_ = (uint)bVar2 * auVar17._16_4_ | (uint)!bVar2 * auVar20._16_4_;
            bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar18._20_4_ = (uint)bVar2 * auVar17._20_4_ | (uint)!bVar2 * auVar20._20_4_;
            bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar18._24_4_ = (uint)bVar2 * auVar17._24_4_ | (uint)!bVar2 * auVar20._24_4_;
            bVar2 = (bool)((byte)(uVar15 >> 7) & 1);
            auVar18._28_4_ = (uint)bVar2 * auVar17._28_4_ | (uint)!bVar2 * auVar20._28_4_;
            auVar18._32_4_ =
                 (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
            bVar2 = (bool)(bVar8 >> 1 & 1);
            auVar18._36_4_ = (uint)bVar2 * auVar17._36_4_ | (uint)!bVar2 * auVar20._36_4_;
            bVar2 = (bool)(bVar8 >> 2 & 1);
            auVar18._40_4_ = (uint)bVar2 * auVar17._40_4_ | (uint)!bVar2 * auVar20._40_4_;
            bVar2 = (bool)(bVar8 >> 3 & 1);
            auVar18._44_4_ = (uint)bVar2 * auVar17._44_4_ | (uint)!bVar2 * auVar20._44_4_;
            bVar2 = (bool)(bVar8 >> 4 & 1);
            auVar18._48_4_ = (uint)bVar2 * auVar17._48_4_ | (uint)!bVar2 * auVar20._48_4_;
            bVar2 = (bool)(bVar8 >> 5 & 1);
            auVar18._52_4_ = (uint)bVar2 * auVar17._52_4_ | (uint)!bVar2 * auVar20._52_4_;
            bVar2 = (bool)(bVar8 >> 6 & 1);
            auVar18._56_4_ = (uint)bVar2 * auVar17._56_4_ | (uint)!bVar2 * auVar20._56_4_;
            auVar18._60_4_ =
                 (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
            auVar16 = vextracti64x4_avx512f(auVar18,1);
            auVar17 = vpaddd_avx512f(auVar18,ZEXT3264(auVar16));
            auVar3 = vpaddd_avx(auVar17._0_16_,auVar17._16_16_);
            auVar4 = vpshufd_avx(auVar3,0xee);
            auVar3 = vpaddd_avx(auVar3,auVar4);
            auVar4 = vpshufd_avx(auVar3,0x55);
            auVar3 = vpaddd_avx(auVar3,auVar4);
            iVar22 = auVar3._0_4_;
          }
          local_3c[0] = local_3c[0] + iVar22;
          *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f56;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f61;
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar22);
          *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f75;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," i",2);
        }
        uVar5 = *(undefined8 *)(std::cout + -0x18);
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f8a;
        std::ios::widen((char)uVar5 + 'H');
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f95;
        std::ostream::put('H');
        *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121f9d;
        std::ostream::flush();
        iVar12 = iVar12 + 1;
        iVar22 = local_40;
      } while (iVar12 < n_sr);
    }
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121fe4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total:  \t",9);
    iVar12 = local_3c[2];
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121fef;
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122006;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," e, ",4);
    iVar12 = local_3c[1];
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122011;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122028;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," p, ",4);
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122033;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar22);
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122047;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," g",2);
    if (-1 < n_ion_populations) {
      *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x12206b;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      iVar22 = local_3c[0];
      *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x122076;
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar22);
      *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x12208a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," i",2);
    }
    uVar5 = *(undefined8 *)(std::cout + -0x18);
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x12209e;
    std::ios::widen((char)uVar5 + 'H');
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x1220a9;
    std::ostream::put('H');
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x1220b1;
    std::ostream::flush();
  }
  else {
    *(undefined8 *)((long)auStack_60 + lVar6 + 0x10) = 0x121d68;
    MPI_Send(piVar14,uVar10,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  return;
}

Assistant:

void print_number_of_quasiparticles()
{
    // logging number of pseudoparticles in each thread
    int N_qp_e_total = 0;
    int N_qp_p_total = 0;
    int N_qp_g_total = 0;
    int N_qp_i_total = 0;

    int count = 3 + n_ion_populations;
    int data[count];
    data[0] = psr->N_qp_e;
    data[1] = psr->N_qp_p;
    data[2] = psr->N_qp_g;
    for (int j=0; j<n_ion_populations; j++) {
        data[3+j] = psr->N_qp_i[j];
    }

    if (mpi_rank == 0) {
        for (int i=0; i<n_sr; i++) {
            if (i != 0) {
                MPI_Recv(data, count, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
            }
            N_qp_e_total += data[0];
            N_qp_p_total += data[1];
            N_qp_g_total += data[2];
            cout << " Thread #" << i << ":\t" << data[0] << " e, " << data[1] << " p, " << data[2] << " g";
            if (n_ion_populations >= 0)
            {
                int N_qp_i = 0;
                for (int j=0; j<n_ion_populations; j++)
                {
                    N_qp_i += data[3+j];
                }
                N_qp_i_total += N_qp_i;
                cout << ", " << N_qp_i << " i";
            }
            cout << endl;
        }
        cout << "Total:  \t" << N_qp_e_total << " e, " << N_qp_p_total << " p, " << N_qp_g_total << " g";
        if (n_ion_populations >= 0)
        {
            cout << ", " << N_qp_i_total << " i";
        }
        cout << endl;
    } else {
        MPI_Send(data, count, MPI_INT, 0, 0, MPI_COMM_WORLD);
    }
}